

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_MakeGlyphBitmapSubpixel
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int glyph)

{
  int iVar1;
  int in_ECX;
  float in_EDX;
  stbtt__bitmap *in_RSI;
  undefined4 in_R8D;
  float in_R9D;
  undefined4 in_XMM0_Da;
  int in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  void *unaff_retaddr;
  stbtt__bitmap gbm;
  int num_verts;
  stbtt_vertex *vertices;
  int iy0;
  int ix0;
  stbtt_vertex **in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  
  iVar1 = stbtt_GetGlyphShape((stbtt_fontinfo *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  stbtt_GetGlyphBitmapBoxSubpixel
            ((stbtt_fontinfo *)CONCAT44(in_R8D,in_XMM0_Da),in_XMM1_Da,in_XMM2_Da,in_XMM3_Da,in_R9D,
             in_stack_ffffffffffffffcc,
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((in_EDX != 0.0) && (in_ECX != 0)) {
    stbtt_Rasterize(in_RSI,in_EDX,(stbtt_vertex *)CONCAT44(in_R8D,in_XMM0_Da),in_XMM1_Da,in_XMM2_Da,
                    in_XMM3_Da,in_R9D,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,unaff_retaddr);
  }
  ImGui::MemFree((void *)CONCAT44(in_ECX,in_EDX));
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixel(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int glyph)
{
   int ix0,iy0;
   stbtt_vertex *vertices;
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);
   stbtt__bitmap gbm;

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,0,0);
   gbm.pixels = output;
   gbm.w = out_w;
   gbm.h = out_h;
   gbm.stride = out_stride;

   if (gbm.w && gbm.h)
      stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0,iy0, 1, info->userdata);

   STBTT_free(vertices, info->userdata);
}